

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall
t_perl_generator::generate_serialize_field
          (t_perl_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  t_struct *ptVar1;
  t_field *ptVar2;
  uint uVar3;
  t_type *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *psVar5;
  ulong uVar6;
  ostream *poVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [12];
  string local_1c8;
  t_base local_1a4;
  undefined1 local_1a0 [4];
  t_base tbase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_5d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  t_struct *local_30;
  t_type *type;
  string *prefix_local;
  t_field *tfield_local;
  ostream *out_local;
  t_perl_generator *this_local;
  
  type = (t_type *)prefix;
  prefix_local = (string *)tfield;
  tfield_local = (t_field *)out;
  out_local = (ostream *)this;
  type_00 = t_field::get_type(tfield);
  local_30 = (t_struct *)t_generator::get_true_type(type_00);
  uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[4])();
  if ((uVar3 & 1) == 0) {
    uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    if (((uVar3 & 1) == 0) &&
       (uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
      uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xd])();
      ptVar2 = tfield_local;
      ptVar1 = local_30;
      if ((uVar3 & 1) == 0) {
        uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[5])();
        if (((uVar3 & 1) == 0) &&
           (uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[10])(), (uVar3 & 1) == 0)) {
          uVar8 = std::__cxx11::string::c_str();
          t_field::get_name_abi_cxx11_((t_field *)prefix_local);
          uVar9 = std::__cxx11::string::c_str();
          (*(local_30->super_t_type).super_t_doc._vptr_t_doc[3])();
          uVar10 = std::__cxx11::string::c_str();
          printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",uVar8,uVar9,uVar10);
        }
        else {
          psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
          std::__cxx11::string::string((string *)local_140,(string *)psVar5);
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0,prefix,"{");
            psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
            std::operator+(&local_180,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0,psVar5);
            std::operator+(&local_160,&local_180,"}");
            std::__cxx11::string::operator=((string *)local_140,(string *)&local_160);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)local_1a0);
          }
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)tfield_local);
          std::operator<<(poVar7,"$xfer += $output->");
          uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[5])();
          if ((uVar3 & 1) == 0) {
            uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[10])();
            if ((uVar3 & 1) != 0) {
              poVar7 = std::operator<<((ostream *)tfield_local,"writeI32($");
              poVar7 = std::operator<<(poVar7,(string *)local_140);
              std::operator<<(poVar7,");");
            }
          }
          else {
            local_1a4 = t_base_type::get_base((t_base_type *)local_30);
            switch(local_1a4) {
            case TYPE_VOID:
              pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_140);
              __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            case TYPE_STRING:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeString($");
              poVar7 = std::operator<<(poVar7,(string *)local_140);
              std::operator<<(poVar7,");");
              break;
            case TYPE_BOOL:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeBool($");
              poVar7 = std::operator<<(poVar7,(string *)local_140);
              std::operator<<(poVar7,");");
              break;
            case TYPE_I8:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeByte($");
              poVar7 = std::operator<<(poVar7,(string *)local_140);
              std::operator<<(poVar7,");");
              break;
            case TYPE_I16:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeI16($");
              poVar7 = std::operator<<(poVar7,(string *)local_140);
              std::operator<<(poVar7,");");
              break;
            case TYPE_I32:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeI32($");
              poVar7 = std::operator<<(poVar7,(string *)local_140);
              std::operator<<(poVar7,");");
              break;
            case TYPE_I64:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeI64($");
              poVar7 = std::operator<<(poVar7,(string *)local_140);
              std::operator<<(poVar7,");");
              break;
            case TYPE_DOUBLE:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeDouble($");
              poVar7 = std::operator<<(poVar7,(string *)local_140);
              std::operator<<(poVar7,");");
              break;
            default:
              auVar11 = __cxa_allocate_exception(0x20);
              t_base_type::t_base_name_abi_cxx11_
                        (&local_1c8,(t_base_type *)(ulong)local_1a4,auVar11._8_4_);
              std::operator+(auVar11._0_8_,"compiler error: no PERL name for base type ",&local_1c8)
              ;
              __cxa_throw(auVar11._0_8_,&std::__cxx11::string::typeinfo,
                          std::__cxx11::string::~string);
            }
          }
          std::operator<<((ostream *)tfield_local,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)local_140);
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&name.field_2 + 8),prefix,"{");
        psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
        std::operator+(&local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&name.field_2 + 8),psVar5);
        std::operator+(&local_e0,&local_100,"}");
        generate_serialize_container(this,(ostream *)ptVar2,&ptVar1->super_t_type,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      }
    }
    else {
      ptVar2 = tfield_local;
      ptVar1 = local_30;
      std::operator+(&local_c0,prefix,"{");
      psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
      std::operator+(&local_a0,&local_c0,psVar5);
      std::operator+(&local_80,&local_a0,"}");
      generate_serialize_struct(this,(ostream *)ptVar2,ptVar1,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    return;
  }
  local_5d = 1;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  std::operator+(&local_50,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
  psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
  std::operator+(pbVar4,&local_50,psVar5);
  local_5d = 0;
  __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_perl_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + "{" + tfield->get_name() + "}");
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + "{" + tfield->get_name() + "}");
  } else if (type->is_base_type() || type->is_enum()) {

    string name = tfield->get_name();

    // Hack for when prefix is defined (always a hash ref)
    if (!prefix.empty())
      name = prefix + "{" + tfield->get_name() + "}";

    indent(out) << "$xfer += $output->";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        out << "writeString($" << name << ");";
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool($" << name << ");";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte($" << name << ");";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16($" << name << ");";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32($" << name << ");";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64($" << name << ");";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble($" << name << ");";
        break;
      default:
        throw "compiler error: no PERL name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "writeI32($" << name << ");";
    }
    out << endl;

  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}